

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O3

STRING_HANDLE STRING_construct(char *psz)

{
  STRING_HANDLE __ptr;
  size_t sVar1;
  char *__dest;
  LOGGER_LOG p_Var2;
  size_t __size;
  
  if (psz != (char *)0x0) {
    __ptr = (STRING_HANDLE)malloc(8);
    if (__ptr == (STRING_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/strings.c"
                  ,"STRING_construct",0x72,1,"Failure allocating value.");
        return (STRING_HANDLE)0x0;
      }
    }
    else {
      sVar1 = strlen(psz);
      __size = 0xffffffffffffffff;
      if (sVar1 + 1 != 0) {
        __size = sVar1 + 1;
      }
      if (__size != 0xffffffffffffffff) {
        __dest = (char *)malloc(__size);
        __ptr->s = __dest;
        if (__dest != (char *)0x0) {
          memcpy(__dest,psz,__size);
          return __ptr;
        }
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/strings.c"
                  ,"STRING_construct",0x6a,1,"Failure allocating constructed value. size=%zu",__size
                 );
      }
      free(__ptr);
    }
  }
  return (STRING_HANDLE)0x0;
}

Assistant:

STRING_HANDLE STRING_construct(const char* psz)
{
    STRING_HANDLE result;
    if (psz == NULL)
    {
        /* Codes_SRS_STRING_07_005: [If the supplied const char* is NULL STRING_construct shall return a NULL value.] */
        result = NULL;
    }
    else
    {
        STRING* str;
        if ((str = (STRING*)malloc(sizeof(STRING))) != NULL)
        {
            size_t nLen = safe_add_size_t(strlen(psz), 1);
            if (nLen != SIZE_MAX && (str->s = (char*)malloc(nLen)) != NULL)
            {
                (void)memcpy(str->s, psz, nLen);
                result = (STRING_HANDLE)str;
            }
            /* Codes_SRS_STRING_07_032: [STRING_construct encounters any error it shall return a NULL value.] */
            else
            {
                LogError("Failure allocating constructed value. size=%zu", nLen);
                free(str);
                result = NULL;
            }
        }
        else
        {
            /* Codes_SRS_STRING_07_032: [STRING_construct encounters any error it shall return a NULL value.] */
            LogError("Failure allocating value.");
            result = NULL;
        }
    }
    return result;
}